

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddImage
          (ImDrawList *this,ImTextureID user_texture_id,ImVec2 *a,ImVec2 *b,ImVec2 *uv_a,
          ImVec2 *uv_b,ImU32 col)

{
  long lVar1;
  
  if (col < 0x1000000) {
    return;
  }
  lVar1 = (long)(this->_TextureIdStack).Size;
  if ((lVar1 != 0) && ((this->_TextureIdStack).Data[lVar1 + -1] == user_texture_id)) {
    PrimReserve(this,6,4);
    PrimRectUV(this,a,b,uv_a,uv_b,col);
    return;
  }
  PushTextureID(this,user_texture_id);
  PrimReserve(this,6,4);
  PrimRectUV(this,a,b,uv_a,uv_b,col);
  (this->_TextureIdStack).Size = (this->_TextureIdStack).Size + -1;
  UpdateTextureID(this);
  return;
}

Assistant:

void ImDrawList::AddImage(ImTextureID user_texture_id, const ImVec2& a, const ImVec2& b, const ImVec2& uv_a, const ImVec2& uv_b, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    const bool push_texture_id = _TextureIdStack.empty() || user_texture_id != _TextureIdStack.back();
    if (push_texture_id)
        PushTextureID(user_texture_id);

    PrimReserve(6, 4);
    PrimRectUV(a, b, uv_a, uv_b, col);

    if (push_texture_id)
        PopTextureID();
}